

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void HUF_fillDTableX2ForWeight
               (HUF_DEltX2 *DTableRank,sortedSymbol_t *begin,sortedSymbol_t *end,U32 nbBits,
               U32 tableLog,U16 baseSeq,int level)

{
  HUF_DEltX2 *pHVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  undefined2 in_register_0000008a;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  iVar5 = CONCAT22(in_register_0000008a,baseSeq);
  uVar6 = 1 << ((char)tableLog - (char)nbBits & 0x1fU);
  iVar4 = level * 0x1000000 + nbBits * 0x10000;
  switch(uVar6) {
  case 1:
    for (; begin != end; begin = begin + 1) {
      uVar6 = (uint)begin->symbol * 0x100 + iVar5;
      if (level == 1) {
        uVar6 = (uint)begin->symbol;
      }
      *DTableRank = (HUF_DEltX2)(uVar6 + iVar4);
      DTableRank = DTableRank + 1;
    }
    break;
  case 2:
    for (; begin != end; begin = begin + 1) {
      uVar6 = (uint)begin->symbol * 0x100 + iVar5;
      if (level == 1) {
        uVar6 = (uint)begin->symbol;
      }
      *DTableRank = (HUF_DEltX2)(uVar6 + iVar4);
      DTableRank[1] = (HUF_DEltX2)(uVar6 + iVar4);
      DTableRank = DTableRank + 2;
    }
    break;
  default:
    for (; begin != end; begin = begin + 1) {
      uVar2 = (uint)begin->symbol * 0x100 + iVar5;
      if (level == 1) {
        uVar2 = (uint)begin->symbol;
      }
      lVar3 = (ulong)(uVar2 + iVar4) * 0x100000001;
      pHVar1 = DTableRank + uVar6;
      for (lVar7 = (ulong)uVar6 * 4; lVar7 != 0; lVar7 = lVar7 + -0x20) {
        *(long *)DTableRank = lVar3;
        *(long *)(DTableRank + 2) = lVar3;
        *(long *)(DTableRank + 4) = lVar3;
        *(long *)(DTableRank + 6) = lVar3;
        DTableRank = DTableRank + 8;
      }
      DTableRank = pHVar1;
    }
    break;
  case 4:
    for (; begin != end; begin = begin + 1) {
      uVar6 = (uint)begin->symbol * 0x100 + iVar5;
      if (level == 1) {
        uVar6 = (uint)begin->symbol;
      }
      lVar7 = (ulong)(uVar6 + iVar4) * 0x100000001;
      *(long *)DTableRank = lVar7;
      *(long *)(DTableRank + 2) = lVar7;
      DTableRank = DTableRank + 4;
    }
    break;
  case 8:
    for (; begin != end; begin = begin + 1) {
      uVar6 = (uint)begin->symbol * 0x100 + iVar5;
      if (level == 1) {
        uVar6 = (uint)begin->symbol;
      }
      lVar7 = (ulong)(uVar6 + iVar4) * 0x100000001;
      *(long *)DTableRank = lVar7;
      *(long *)(DTableRank + 2) = lVar7;
      *(long *)(DTableRank + 4) = lVar7;
      *(long *)(DTableRank + 6) = lVar7;
      DTableRank = DTableRank + 8;
    }
  }
  return;
}

Assistant:

static void HUF_fillDTableX2ForWeight(
    HUF_DEltX2* DTableRank,
    sortedSymbol_t const* begin, sortedSymbol_t const* end,
    U32 nbBits, U32 tableLog,
    U16 baseSeq, int const level)
{
    U32 const length = 1U << ((tableLog - nbBits) & 0x1F /* quiet static-analyzer */);
    const sortedSymbol_t* ptr;
    assert(level >= 1 && level <= 2);
    switch (length) {
    case 1:
        for (ptr = begin; ptr != end; ++ptr) {
            HUF_DEltX2 const DElt = HUF_buildDEltX2(ptr->symbol, nbBits, baseSeq, level);
            *DTableRank++ = DElt;
        }
        break;
    case 2:
        for (ptr = begin; ptr != end; ++ptr) {
            HUF_DEltX2 const DElt = HUF_buildDEltX2(ptr->symbol, nbBits, baseSeq, level);
            DTableRank[0] = DElt;
            DTableRank[1] = DElt;
            DTableRank += 2;
        }
        break;
    case 4:
        for (ptr = begin; ptr != end; ++ptr) {
            U64 const DEltX2 = HUF_buildDEltX2U64(ptr->symbol, nbBits, baseSeq, level);
            ZSTD_memcpy(DTableRank + 0, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 2, &DEltX2, sizeof(DEltX2));
            DTableRank += 4;
        }
        break;
    case 8:
        for (ptr = begin; ptr != end; ++ptr) {
            U64 const DEltX2 = HUF_buildDEltX2U64(ptr->symbol, nbBits, baseSeq, level);
            ZSTD_memcpy(DTableRank + 0, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 2, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 4, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 6, &DEltX2, sizeof(DEltX2));
            DTableRank += 8;
        }
        break;
    default:
        for (ptr = begin; ptr != end; ++ptr) {
            U64 const DEltX2 = HUF_buildDEltX2U64(ptr->symbol, nbBits, baseSeq, level);
            HUF_DEltX2* const DTableRankEnd = DTableRank + length;
            for (; DTableRank != DTableRankEnd; DTableRank += 8) {
                ZSTD_memcpy(DTableRank + 0, &DEltX2, sizeof(DEltX2));
                ZSTD_memcpy(DTableRank + 2, &DEltX2, sizeof(DEltX2));
                ZSTD_memcpy(DTableRank + 4, &DEltX2, sizeof(DEltX2));
                ZSTD_memcpy(DTableRank + 6, &DEltX2, sizeof(DEltX2));
            }
        }
        break;
    }
}